

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O3

pair<llvm::ReplacementItem,_llvm::StringRef> *
llvm::formatv_object_base::splitLiteralAndReplacement
          (pair<llvm::ReplacementItem,_llvm::StringRef> *__return_storage_ptr__,StringRef Fmt)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  size_t in_RCX;
  ulong __n;
  char *__s;
  size_t FindBegin;
  ulong uVar4;
  StringRef Spec;
  undefined1 auStack_80 [8];
  Optional<llvm::ReplacementItem> RI;
  
  __n = Fmt.Length;
  __s = Fmt.Data;
  if (__n != 0) {
    RI.Storage._64_8_ = __n - 1;
    uVar2 = 0;
    do {
      pvVar1 = memchr(__s + uVar2,0x7b,__n - uVar2);
      if (pvVar1 == (void *)0x0) {
        uVar2 = 0xffffffffffffffff;
LAB_00d9677b:
        if (__n < uVar2) {
          uVar2 = __n;
        }
        (__return_storage_ptr__->first).Index = 0;
        (__return_storage_ptr__->first).Align = 0;
        (__return_storage_ptr__->first).Type = Literal;
        (__return_storage_ptr__->first).Spec.Data = __s;
        (__return_storage_ptr__->first).Spec.Length = uVar2;
        (__return_storage_ptr__->first).Where = Right;
        (__return_storage_ptr__->first).Pad = '\0';
        *(ulong *)&(__return_storage_ptr__->first).field_0x2d = (ulong)(uint3)auStack_80._0_3_;
        *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
        *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
LAB_00d96841:
        (__return_storage_ptr__->second).Data = __s + uVar2;
        (__return_storage_ptr__->second).Length = __n - uVar2;
        return __return_storage_ptr__;
      }
      uVar2 = (long)pvVar1 - (long)__s;
      if (uVar2 != 0) goto LAB_00d9677b;
      uVar2 = 0;
      do {
        if (__s[uVar2] != '{') goto LAB_00d9669e;
        uVar2 = uVar2 + 1;
      } while (__n != uVar2);
      uVar2 = 0xffffffffffffffff;
LAB_00d9669e:
      if (__n < uVar2) {
        uVar2 = __n;
      }
      if (1 < uVar2) {
        uVar4 = uVar2 & 0xfffffffffffffffe;
        if (uVar4 <= __n) {
          uVar3 = uVar2 >> 1;
          if (__n < uVar2 >> 1) {
            uVar3 = __n;
          }
          (__return_storage_ptr__->first).Index = 0;
          (__return_storage_ptr__->first).Align = 0;
          (__return_storage_ptr__->first).Type = Literal;
          (__return_storage_ptr__->first).Spec.Data = __s;
          (__return_storage_ptr__->first).Spec.Length = uVar3;
          (__return_storage_ptr__->first).Where = Right;
          (__return_storage_ptr__->first).Pad = '\0';
          *(ulong *)&(__return_storage_ptr__->first).field_0x2d = (ulong)(uint3)auStack_80._0_3_;
          *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
          *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
          (__return_storage_ptr__->second).Data = __s + uVar4;
          (__return_storage_ptr__->second).Length = __n - uVar4;
          return __return_storage_ptr__;
        }
        __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                      ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
      }
      pvVar1 = memchr(__s,0x7d,__n);
      if ((pvVar1 == (void *)0x0) || (uVar4 = (long)pvVar1 - (long)__s, uVar4 == 0xffffffffffffffff)
         ) {
        __assert_fail("false && \"Unterminated brace sequence.  Escape with {{ for a literal brace.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                      ,0x75,
                      "static std::pair<ReplacementItem, StringRef> llvm::formatv_object_base::splitLiteralAndReplacement(StringRef)"
                     );
      }
      if (__n != 1) {
        pvVar1 = memchr((formatv_object_base *)(__s + 1),0x7b,RI.Storage._64_8_);
        in_RCX = CONCAT71((int7)(in_RCX >> 8),pvVar1 != (void *)0x0);
        uVar2 = (long)pvVar1 - (long)__s;
        if (uVar2 < uVar4 && pvVar1 != (void *)0x0) goto LAB_00d9677b;
      }
      uVar2 = uVar4 + (uVar4 == 0);
      if (__n < uVar4) {
        uVar2 = __n;
      }
      Spec.Data = (char *)(uVar2 - 1);
      uVar2 = uVar4 + 1;
      Spec.Length = in_RCX;
      parseReplacementItem
                ((Optional<llvm::ReplacementItem> *)auStack_80,(formatv_object_base *)(__s + 1),Spec
                );
      if (RI.Storage.field_0.value.Options.Length._0_1_ == '\x01') {
        if (__n < uVar2) {
          uVar2 = __n;
        }
        (__return_storage_ptr__->first).Options.Data = (char *)RI.Storage.field_0._40_8_;
        (__return_storage_ptr__->first).Options.Length =
             (size_t)RI.Storage.field_0.value.Options.Data;
        (__return_storage_ptr__->first).Align = RI.Storage.field_0.value.Index;
        (__return_storage_ptr__->first).Where = RI.Storage.field_0.value.Align._0_4_;
        (__return_storage_ptr__->first).Pad = RI.Storage.field_0._36_1_;
        *(undefined3 *)&(__return_storage_ptr__->first).field_0x2d = RI.Storage.field_0._37_3_;
        (__return_storage_ptr__->first).Spec.Length =
             CONCAT53(RI.Storage.field_0._11_5_,RI.Storage.field_0._8_3_);
        (__return_storage_ptr__->first).Index = RI.Storage.field_0.value.Spec.Length;
        *(ulong *)&__return_storage_ptr__->first = CONCAT53(auStack_80._3_5_,auStack_80._0_3_);
        (__return_storage_ptr__->first).Spec.Data =
             (char *)CONCAT17(RI.Storage.field_0._7_1_,
                              CONCAT43(RI.Storage.field_0._3_4_,RI.Storage.field_0.value.Type._0_3_)
                             );
        goto LAB_00d96841;
      }
    } while (uVar2 < __n);
  }
  (__return_storage_ptr__->first).Index = 0;
  (__return_storage_ptr__->first).Align = 0;
  (__return_storage_ptr__->second).Data = (char *)0x0;
  (__return_storage_ptr__->second).Length = 0;
  (__return_storage_ptr__->first).Type = Literal;
  (__return_storage_ptr__->first).Spec.Data = __s;
  (__return_storage_ptr__->first).Spec.Length = __n;
  (__return_storage_ptr__->first).Where = Right;
  (__return_storage_ptr__->first).Pad = '\0';
  *(ulong *)&(__return_storage_ptr__->first).field_0x2d = (ulong)(uint3)auStack_80._0_3_;
  *(undefined8 *)((long)&(__return_storage_ptr__->first).Options.Data + 5) = 0;
  *(undefined4 *)((long)&(__return_storage_ptr__->first).Options.Length + 4) = 0;
  return __return_storage_ptr__;
}

Assistant:

std::pair<ReplacementItem, StringRef>
formatv_object_base::splitLiteralAndReplacement(StringRef Fmt) {
  std::size_t From = 0;
  while (From < Fmt.size() && From != StringRef::npos) {
    std::size_t BO = Fmt.find_first_of('{', From);
    // Everything up until the first brace is a literal.
    if (BO != 0)
      return std::make_pair(ReplacementItem{Fmt.substr(0, BO)}, Fmt.substr(BO));

    StringRef Braces =
        Fmt.drop_front(BO).take_while([](char C) { return C == '{'; });
    // If there is more than one brace, then some of them are escaped.  Treat
    // these as replacements.
    if (Braces.size() > 1) {
      size_t NumEscapedBraces = Braces.size() / 2;
      StringRef Middle = Fmt.substr(BO, NumEscapedBraces);
      StringRef Right = Fmt.drop_front(BO + NumEscapedBraces * 2);
      return std::make_pair(ReplacementItem{Middle}, Right);
    }
    // An unterminated open brace is undefined.  We treat the rest of the string
    // as a literal replacement, but we assert to indicate that this is
    // undefined and that we consider it an error.
    std::size_t BC = Fmt.find_first_of('}', BO);
    if (BC == StringRef::npos) {
      assert(
          false &&
          "Unterminated brace sequence.  Escape with {{ for a literal brace.");
      return std::make_pair(ReplacementItem{Fmt}, StringRef());
    }

    // Even if there is a closing brace, if there is another open brace before
    // this closing brace, treat this portion as literal, and try again with the
    // next one.
    std::size_t BO2 = Fmt.find_first_of('{', BO + 1);
    if (BO2 < BC)
      return std::make_pair(ReplacementItem{Fmt.substr(0, BO2)},
                            Fmt.substr(BO2));

    StringRef Spec = Fmt.slice(BO + 1, BC);
    StringRef Right = Fmt.substr(BC + 1);

    auto RI = parseReplacementItem(Spec);
    if (RI.hasValue())
      return std::make_pair(*RI, Right);

    // If there was an error parsing the replacement item, treat it as an
    // invalid replacement spec, and just continue.
    From = BC + 1;
  }
  return std::make_pair(ReplacementItem{Fmt}, StringRef());
}